

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O3

void applyMeantoneTemperament(MidiFile *midifile,int base)

{
  int iVar1;
  MidiEventList *pMVar2;
  int iVar3;
  uint aTrack;
  MidiEvent event;
  MidiEvent MStack_68;
  
  iVar1 = smf::MidiFile::getTrackCount(midifile);
  smf::MidiEvent::MidiEvent(&MStack_68);
  MStack_68.tick = 0;
  iVar3 = base + 1;
  if (base < 9) {
    iVar3 = base;
  }
  smf::MidiMessage::makePitchBend(&MStack_68.super_MidiMessage,iVar3,0,0x40);
  aTrack = (uint)(iVar1 != 1);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  iVar3 = base + 2;
  if (base < 8) {
    iVar3 = base + 1;
  }
  smf::MidiMessage::makePitchBend(&MStack_68.super_MidiMessage,iVar3,0x29,0x38);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend(&MStack_68.super_MidiMessage,(base < 7 ^ 3) + base,0x69,0x3d);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend
            (&MStack_68.super_MidiMessage,(base - (uint)(base < 6)) + 4,0x26,0x43);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend(&MStack_68.super_MidiMessage,(base < 5 ^ 5) + base,0x4f,0x3b);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend
            (&MStack_68.super_MidiMessage,(base - (uint)(base < 4)) + 6,0xb,0x41);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend(&MStack_68.super_MidiMessage,(base < 3 ^ 7) + base,0x38,0x39);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend
            (&MStack_68.super_MidiMessage,(base - (uint)(base < 2)) + 8,0x75,0x3e);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend(&MStack_68.super_MidiMessage,(base < 1 ^ 9) + base,0x1e,0x37);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend(&MStack_68.super_MidiMessage,(base >> 0x1f) + base + 10,0x5a,0x3c)
  ;
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend(&MStack_68.super_MidiMessage,(base < -1 ^ 0xb) + base,0x17,0x42);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBend
            (&MStack_68.super_MidiMessage,(base - (uint)(base < -2)) + 0xc,0x44,0x3a);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiEvent::~MidiEvent(&MStack_68);
  return;
}

Assistant:

void applyMeantoneTemperament(MidiFile& midifile, int base) {
	int tracks = midifile.getTrackCount();
	int track = (tracks == 1) ? 0 : 1;
	MidiEvent event;
	event.tick = 0;
	int chan;

	chan = 0 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 0, 64);
	midifile[track].append(event); // C:    0   cents from equal temperament

	chan = 1 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 41, 56);
	midifile[track].append(event); // C#: -24.0 cents from equal temperament

	chan = 2 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 105, 61);
	midifile[track].append(event); // D:   -6.8 cents from equal temperament

	chan = 3 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 38, 67);
	midifile[track].append(event); // Ef: +10.3 cents from equal temperament

	chan = 4 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 79, 59);
	midifile[track].append(event); // E:  -13.7 cents from equal temperament

	chan = 5 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 11, 65);
	midifile[track].append(event); // F:   +3.4 cents from equal temperament

	chan = 6 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 56, 57);
	midifile[track].append(event); // F#: -20.5 cents from equal temperament

	chan = 7 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 117, 62);
	midifile[track].append(event); // G:   -3.4 cents from equal temperament

	chan = 8 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 30, 55);
	midifile[track].append(event); // Af: -27.4 cents from equal temperament

	chan = 9 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 90, 60);
	midifile[track].append(event); // A:  -10.3 cents from equal temperament

	chan = 10 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 23, 66);
	midifile[track].append(event); // Bf:  +6.8 cents from equal temperament

	chan = 11 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 68, 58);
	midifile[track].append(event); // B:  -17.1 cents from equal temperament
}